

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

ssize_t MAFSA_automaton_find(MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l)

{
  int iVar1;
  uint uVar2;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  MAFSA_letter label;
  uint32_t where;
  uint32_t current;
  uint32_t i;
  uint32_t state;
  uint32_t data;
  uint uVar3;
  ssize_t local_8;
  
  data = *(uint32_t *)*in_RDI;
  state = 0;
  uVar3 = 0;
  while (uVar2 = uVar3, uVar3 < in_RDX) {
    uVar2 = uVar3 + 1;
    state = MAFSA_delta((uint32_t *)CONCAT44(uVar2,data),state,
                        *(MAFSA_letter *)(in_RSI + (ulong)uVar3));
    if (state == 0) break;
    data = *(uint32_t *)(*in_RDI + (ulong)state * 4);
    uVar3 = uVar2;
  }
  if (uVar2 < in_RDX) {
    local_8 = 0;
  }
  else if (state == 0) {
    local_8 = 0;
  }
  else {
    iVar1 = node_is_final(data);
    if (iVar1 == 0) {
      local_8 = 0;
    }
    else {
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

extern ssize_t MAFSA_automaton_find(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l)
{
    uint32_t i = 0;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 0;

    while (i < sz_l)
    {
        MAFSA_letter label = l[i++];

        where = MAFSA_delta(ma->ptr_links, current, label);

        if (where)
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i < sz_l) return 0;
    if (!where) return 0;
    if (!node_is_final(current)) return 0;

    return 1;
}